

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueExample.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  Slot<int> *pSVar2;
  thread t2;
  thread t1;
  MPMCQueue<int> q;
  long *local_158;
  long local_150;
  long local_148;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> local_140;
  
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            (&local_140,10,(allocator<rigtorp::mpmc::Slot<int>_> *)&local_158);
  local_148 = 0;
  local_158 = (long *)operator_new(0x10);
  *local_158 = (long)&PTR___State_00104d20;
  local_158[1] = (long)&local_140;
  std::thread::_M_start_thread(&local_148,&local_158,0);
  if (local_158 != (long *)0x0) {
    (**(code **)(*local_158 + 8))();
  }
  local_150 = 0;
  local_158 = (long *)operator_new(0x10);
  *local_158 = (long)&PTR___State_00104d60;
  local_158[1] = (long)&local_140;
  std::thread::_M_start_thread(&local_150,&local_158,0);
  if (local_158 != (long *)0x0) {
    (**(code **)(*local_158 + 8))();
  }
  LOCK();
  uVar1 = (long)local_140.head_.super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  pSVar2 = local_140.slots_ +
           (ulong)local_140.head_.super___atomic_base<unsigned_long>._M_i % local_140.capacity_;
  do {
  } while (((ulong)local_140.head_.super___atomic_base<unsigned_long>._M_i / local_140.capacity_) *
           2 != (pSVar2->turn).super___atomic_base<unsigned_long>._M_i);
  pSVar2->storage = (type)0x1;
  (pSVar2->turn).super___atomic_base<unsigned_long>._M_i =
       ((ulong)local_140.head_.super___atomic_base<unsigned_long>._M_i / local_140.capacity_) * 2 +
       1;
  LOCK();
  local_140.head_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)local_140.head_.super___atomic_base<unsigned_long>._M_i + 2);
  UNLOCK();
  local_140.slots_ = local_140.slots_ + uVar1 % local_140.capacity_;
  do {
  } while ((uVar1 / local_140.capacity_) * 2 !=
           ((local_140.slots_)->turn).super___atomic_base<unsigned_long>._M_i);
  (local_140.slots_)->storage = (type)0x2;
  ((local_140.slots_)->turn).super___atomic_base<unsigned_long>._M_i =
       (uVar1 / local_140.capacity_) * 2 + 1;
  std::thread::join();
  std::thread::join();
  if ((local_150 == 0) && (local_148 == 0)) {
    rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue(&local_140);
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  MPMCQueue<int> q(10);
  auto t1 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t1 " << v << "\n";
  });
  auto t2 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t2 " << v << "\n";
  });
  q.push(1);
  q.push(2);
  t1.join();
  t2.join();

  return 0;
}